

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O0

void __thiscall deqp::gls::TextureRenderer::render(TextureRenderer *this,deUint32 texture)

{
  deUint32 dVar1;
  GLenum GVar2;
  deBool dVar3;
  GLuint index;
  GLint location;
  TestError *pTVar4;
  deUint32 texLoc;
  deUint32 coordLoc;
  deUint32 texture_local;
  TextureRenderer *this_local;
  
  do {
    dVar1 = glu::ShaderProgram::getProgram(this->m_program);
    glwUseProgram(dVar1);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glUseProgram(m_program->getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0xe1);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar1 = glu::ShaderProgram::getProgram(this->m_program);
  index = glwGetAttribLocation(dVar1,"a_coord");
  GVar2 = glwGetError();
  glu::checkError(GVar2,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0xe4);
  while ((dVar3 = ::deGetFalse(), dVar3 == 0 && (index != 0xffffffff))) {
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      dVar1 = this->m_vao;
      while (dVar1 != 0) {
        glwBindVertexArray(this->m_vao);
        GVar2 = glwGetError();
        glu::checkError(GVar2,"glBindVertexArray(m_vao)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                        ,0xe8);
        dVar1 = ::deGetFalse();
      }
      do {
        glwEnableVertexAttribArray(index);
        GVar2 = glwGetError();
        glu::checkError(GVar2,"glEnableVertexAttribArray(coordLoc)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                        ,0xea);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      do {
        glwBindBuffer(0x8892,this->m_coordBuffer);
        GVar2 = glwGetError();
        glu::checkError(GVar2,"glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                        ,0xec);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      do {
        glwVertexAttribPointer(index,2,0x1406,'\0',0,(void *)0x0);
        GVar2 = glwGetError();
        glu::checkError(GVar2,"glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, NULL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                        ,0xed);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      do {
        glwActiveTexture(0x84c0);
        GVar2 = glwGetError();
        glu::checkError(GVar2,"glActiveTexture(GL_TEXTURE0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                        ,0xef);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      do {
        glwBindTexture(0xde1,texture);
        GVar2 = glwGetError();
        glu::checkError(GVar2,"glBindTexture(GL_TEXTURE_2D, texture)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                        ,0xf0);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      dVar1 = glu::ShaderProgram::getProgram(this->m_program);
      location = glwGetUniformLocation(dVar1,"u_texture");
      GVar2 = glwGetError();
      glu::checkError(GVar2,(char *)0x0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0xf3);
      while ((dVar3 = ::deGetFalse(), dVar3 == 0 && (location != -1))) {
        dVar3 = ::deGetFalse();
        if (dVar3 == 0) {
          do {
            glwUniform1i(location,0);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glUniform1i(texLoc, 0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0xf6);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwBindBuffer(0x8893,this->m_indexBuffer);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0xf8);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwDrawElements(4,6,0x1401,(void *)0x0);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glDrawElements(GL_TRIANGLES, 6, GL_UNSIGNED_BYTE, NULL)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0xf9);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwDisableVertexAttribArray(index);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glDisableVertexAttribArray(coordLoc)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0xfb);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          dVar1 = this->m_vao;
          while (dVar1 != 0) {
            glwBindVertexArray(0);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glBindVertexArray(0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0xfe);
            dVar1 = ::deGetFalse();
          }
          return;
        }
      }
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,(char *)0x0,"texLoc != (deUint32)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                 ,0xf4);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,(char *)0x0,"coordLoc != (deUint32)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
             ,0xe5);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TextureRenderer::render (deUint32 texture)
{
	deUint32 coordLoc = -1;
	deUint32 texLoc	= -1;

	GLU_CHECK_CALL(glUseProgram(m_program->getProgram()));

	coordLoc = glGetAttribLocation(m_program->getProgram(), "a_coord");
	GLU_CHECK();
	TCU_CHECK(coordLoc != (deUint32)-1);

	if (m_vao != 0)
		GLU_CHECK_CALL(glBindVertexArray(m_vao));

	GLU_CHECK_CALL(glEnableVertexAttribArray(coordLoc));

	GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer));
	GLU_CHECK_CALL(glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, NULL));

	GLU_CHECK_CALL(glActiveTexture(GL_TEXTURE0));
	GLU_CHECK_CALL(glBindTexture(GL_TEXTURE_2D, texture));

	texLoc = glGetUniformLocation(m_program->getProgram(), "u_texture");
	GLU_CHECK();
	TCU_CHECK(texLoc != (deUint32)-1);

	GLU_CHECK_CALL(glUniform1i(texLoc, 0));

	GLU_CHECK_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer));
	GLU_CHECK_CALL(glDrawElements(GL_TRIANGLES, 6, GL_UNSIGNED_BYTE, NULL));

	GLU_CHECK_CALL(glDisableVertexAttribArray(coordLoc));

	if (m_vao != 0)
		GLU_CHECK_CALL(glBindVertexArray(0));
}